

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O3

void __thiscall
ContainerAlgorithms::
DefaultDeleter<std::map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>,_true>
::operator()(DefaultDeleter<std::map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>,_true>
             *this,value_type value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmGeneratorTarget *pcVar3;
  
  pcVar3 = value.second;
  if (pcVar3 != (cmGeneratorTarget *)0x0) {
    std::
    _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
    ::~_Rb_tree(&(pcVar3->SourceFlagsMap)._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&(pcVar3->SystemIncludesCache)._M_t);
    std::
    _Rb_tree<const_cmSourceFile_*,_const_cmSourceFile_*,_std::_Identity<const_cmSourceFile_*>,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
    ::~_Rb_tree(&(pcVar3->ExplicitObjectName)._M_t);
    std::
    _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&(pcVar3->Objects)._M_t);
    std::
    _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceEntry>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceEntry>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceEntry>_>_>
    ::~_Rb_tree(&(pcVar3->SourceEntries)._M_t);
    pcVar2 = (pcVar3->ObjectDirectory)._M_dataplus._M_p;
    paVar1 = &(pcVar3->ObjectDirectory).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
  }
  operator_delete(pcVar3,0x138);
  return;
}

Assistant:

void operator()(typename Range::value_type value) const {
    delete value.second;
  }